

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::IngestRanges(DBImpl *this,string *oldfname,string *newfname)

{
  Table *pTVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined8 in_RCX;
  Slice SVar6;
  undefined1 auVar7 [16];
  WriteOptions local_219;
  Status local_218;
  Slice local_210;
  Slice local_200;
  Slice local_1f0;
  Slice local_1e0;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  Slice local_1b0;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  int local_17c;
  undefined1 auStack_178 [4];
  int cmp;
  size_t local_170;
  Slice local_168;
  Slice local_158;
  undefined1 local_148 [8];
  WriteBatch batch;
  Iterator *newiter;
  Status local_118;
  Status local_110;
  Table *local_108;
  Table *newtable;
  RandomAccessFile *newfile;
  uint64_t newfile_size;
  Iterator *olditer;
  Table local_e0;
  Status local_d8;
  Status local_d0;
  Table *local_c8;
  Table *oldtable;
  RandomAccessFile *oldfile;
  uint64_t oldfile_size;
  ReadOptions readoptions;
  undefined1 local_90 [8];
  Options options;
  string *newfname_local;
  string *oldfname_local;
  DBImpl *this_local;
  Status *s;
  
  options.filter_policy._7_1_ = 0;
  Status::Status((Status *)this);
  Options::Options((Options *)local_90);
  options.compression = kNoCompression;
  options.reuse_logs = false;
  options._85_3_ = 0;
  options.max_file_size._0_4_ = 1;
  ReadOptions::ReadOptions((ReadOptions *)&oldfile_size);
  oldfile_size._1_1_ = 1;
  oldtable = (Table *)0x0;
  local_c8 = (Table *)0x0;
  (**(code **)(**(long **)(oldfname + 8) + 0x58))
            (&local_d0,*(long **)(oldfname + 8),newfname,&oldfile);
  Status::operator=((Status *)this,&local_d0);
  Status::~Status(&local_d0);
  bVar3 = Status::ok((Status *)this);
  if (bVar3) {
    (**(code **)(**(long **)(oldfname + 8) + 0x18))
              (&local_d8,*(long **)(oldfname + 8),newfname,&oldtable);
    Status::operator=((Status *)this,&local_d8);
    Status::~Status(&local_d8);
  }
  bVar3 = Status::ok((Status *)this);
  if (bVar3) {
    Table::Open(&local_e0,(Options *)local_90,(RandomAccessFile *)oldtable,(uint64_t)oldfile,
                &local_c8);
    Status::operator=((Status *)this,(Status *)&local_e0);
    Status::~Status((Status *)&local_e0);
  }
  bVar3 = Status::ok((Status *)this);
  pTVar1 = local_c8;
  if (bVar3) {
    newfile_size = (uint64_t)Table::NewIterator(local_c8,(ReadOptions *)&oldfile_size);
    newtable = (Table *)0x0;
    local_108 = (Table *)0x0;
    (**(code **)(**(long **)(oldfname + 8) + 0x58))
              (&local_110,*(long **)(oldfname + 8),in_RCX,&newfile);
    Status::operator=((Status *)this,&local_110);
    Status::~Status(&local_110);
    bVar3 = Status::ok((Status *)this);
    if (bVar3) {
      (**(code **)(**(long **)(oldfname + 8) + 0x18))
                (&local_118,*(long **)(oldfname + 8),in_RCX,&newtable);
      Status::operator=((Status *)this,&local_118);
      Status::~Status(&local_118);
    }
    bVar3 = Status::ok((Status *)this);
    if (bVar3) {
      Table::Open((Table *)&newiter,(Options *)local_90,(RandomAccessFile *)newtable,
                  (uint64_t)newfile,&local_108);
      Status::operator=((Status *)this,(Status *)&newiter);
      Status::~Status((Status *)&newiter);
    }
    bVar3 = Status::ok((Status *)this);
    pTVar1 = local_c8;
    if (bVar3) {
      batch._24_8_ = Table::NewIterator(local_108,(ReadOptions *)&oldfile_size);
      WriteBatch::WriteBatch((WriteBatch *)local_148);
      (**(code **)(*(long *)newfile_size + 0x18))();
      (**(code **)(*(long *)batch._24_8_ + 0x18))();
      while( true ) {
        while( true ) {
          bVar4 = (**(code **)(*(long *)newfile_size + 0x10))();
          if ((bVar4 & 1) == 0) break;
          bVar4 = (**(code **)(*(long *)batch._24_8_ + 0x10))();
          auVar2 = local_90;
          if ((bVar4 & 1) == 0) {
            SVar6 = (Slice)(**(code **)(*(long *)newfile_size + 0x40))();
            _auStack_178 = SVar6;
            WriteBatch::Delete((WriteBatch *)local_148,(Slice *)auStack_178);
            (**(code **)(*(long *)newfile_size + 0x30))();
          }
          else {
            auVar7 = (**(code **)(*(long *)newfile_size + 0x40))();
            local_190 = auVar7;
            auVar7 = (**(code **)(*(long *)batch._24_8_ + 0x40))();
            local_1a0 = auVar7;
            local_17c = (*(*(_func_int ***)auVar2)[2])(auVar2,local_190,local_1a0);
            auVar2 = local_90;
            if (local_17c < 0) {
              SVar6 = (Slice)(**(code **)(*(long *)newfile_size + 0x40))();
              local_1b0 = SVar6;
              WriteBatch::Delete((WriteBatch *)local_148,&local_1b0);
              (**(code **)(*(long *)newfile_size + 0x30))();
            }
            else if (local_17c == 0) {
              auVar7 = (**(code **)(*(long *)newfile_size + 0x48))();
              local_1c0 = auVar7;
              auVar7 = (**(code **)(*(long *)batch._24_8_ + 0x48))();
              local_1d0 = auVar7;
              iVar5 = (*(*(_func_int ***)auVar2)[2])(auVar2,local_1c0,local_1d0);
              if (iVar5 != 0) {
                SVar6 = (Slice)(**(code **)(*(long *)batch._24_8_ + 0x40))();
                local_1e0 = SVar6;
                SVar6 = (Slice)(**(code **)(*(long *)batch._24_8_ + 0x48))();
                local_1f0 = SVar6;
                WriteBatch::Put((WriteBatch *)local_148,&local_1e0,&local_1f0);
              }
              (**(code **)(*(long *)newfile_size + 0x30))();
              (**(code **)(*(long *)batch._24_8_ + 0x30))();
            }
            else {
              SVar6 = (Slice)(**(code **)(*(long *)batch._24_8_ + 0x40))();
              local_200 = SVar6;
              SVar6 = (Slice)(**(code **)(*(long *)batch._24_8_ + 0x48))();
              local_210 = SVar6;
              WriteBatch::Put((WriteBatch *)local_148,&local_200,&local_210);
              (**(code **)(*(long *)batch._24_8_ + 0x30))();
            }
          }
        }
        bVar4 = (**(code **)(*(long *)batch._24_8_ + 0x10))();
        if ((bVar4 & 1) == 0) break;
        SVar6 = (Slice)(**(code **)(*(long *)batch._24_8_ + 0x40))();
        local_158 = SVar6;
        SVar6 = (Slice)(**(code **)(*(long *)batch._24_8_ + 0x48))();
        local_168 = SVar6;
        WriteBatch::Put((WriteBatch *)local_148,&local_158,&local_168);
        (**(code **)(*(long *)batch._24_8_ + 0x30))();
      }
      local_219.sync = false;
      WriteOptions::WriteOptions(&local_219);
      (**(code **)(*(long *)oldfname + 0x20))(&local_218,oldfname,&local_219,local_148);
      Status::operator=((Status *)this,&local_218);
      Status::~Status(&local_218);
      if (newfile_size != 0) {
        (**(code **)(*(long *)newfile_size + 8))();
      }
      pTVar1 = local_c8;
      if (local_c8 != (Table *)0x0) {
        Table::~Table(local_c8);
        operator_delete(pTVar1);
      }
      if (oldtable != (Table *)0x0) {
        (**(code **)&(oldtable->rep_->options).create_if_missing)();
      }
      if (batch._24_8_ != 0) {
        (**(code **)(*(long *)batch._24_8_ + 8))();
      }
      pTVar1 = local_108;
      if (local_108 != (Table *)0x0) {
        Table::~Table(local_108);
        operator_delete(pTVar1);
      }
      if (newtable != (Table *)0x0) {
        (**(code **)&(newtable->rep_->options).create_if_missing)();
      }
      options.filter_policy._7_1_ = 1;
      olditer._4_4_ = 1;
      WriteBatch::~WriteBatch((WriteBatch *)local_148);
    }
    else {
      if (local_c8 != (Table *)0x0) {
        Table::~Table(local_c8);
        operator_delete(pTVar1);
      }
      if (oldtable != (Table *)0x0) {
        (**(code **)&(oldtable->rep_->options).create_if_missing)();
      }
      pTVar1 = local_108;
      if (local_108 != (Table *)0x0) {
        Table::~Table(local_108);
        operator_delete(pTVar1);
      }
      if (newtable != (Table *)0x0) {
        (**(code **)&(newtable->rep_->options).create_if_missing)();
      }
      options.filter_policy._7_1_ = 1;
      olditer._4_4_ = 1;
    }
  }
  else {
    if (local_c8 != (Table *)0x0) {
      Table::~Table(local_c8);
      operator_delete(pTVar1);
    }
    if (oldtable != (Table *)0x0) {
      (**(code **)&(oldtable->rep_->options).create_if_missing)();
    }
    options.filter_policy._7_1_ = 1;
    olditer._4_4_ = 1;
  }
  if ((options.filter_policy._7_1_ & 1) == 0) {
    Status::~Status((Status *)this);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::IngestRanges(const std::string& oldfname, 
                            const std::string& newfname) {
  Status s;
  Options options;
  options.filter_policy = nullptr;
  options.compression = kSnappyCompression;
  ReadOptions readoptions;
  readoptions.fill_cache = true;

  // get iterator for old file
  uint64_t oldfile_size;
  RandomAccessFile* oldfile = nullptr;
  Table* oldtable = nullptr;

  s = env_->GetFileSize(oldfname, &oldfile_size);
  if (s.ok()) {
    s = env_->NewRandomAccessFile(oldfname, &oldfile);
  }

  if (s.ok()) {
    s = Table::Open(options, oldfile, oldfile_size, &oldtable);
  }

  if (!s.ok()) {
    delete oldtable;
    delete oldfile;
    return s;
  }

  Iterator* olditer = oldtable->NewIterator(readoptions);

  // get iterator for new file
  uint64_t newfile_size;
  RandomAccessFile* newfile = nullptr;
  Table* newtable = nullptr;

  s = env_->GetFileSize(newfname, &newfile_size);
  if (s.ok()) {
    s = env_->NewRandomAccessFile(newfname, &newfile);
  }

  if (s.ok()) {
    s = Table::Open(options, newfile, newfile_size, &newtable);
  }

  if (!s.ok()) {
    delete oldtable;
    delete oldfile;
    delete newtable;
    delete newfile;
    return s;
  }

  Iterator* newiter = newtable->NewIterator(readoptions);

  // Merge two iter and update db
  WriteBatch batch;

  olditer->SeekToFirst();
  newiter->SeekToFirst();
  while (true)
  {
    if(!olditer->Valid()) {
      if(newiter->Valid()) {
        batch.Put(newiter->key(), newiter->value());
        newiter->Next();
      }
      else break;
    }
    else if(!newiter->Valid()){
      batch.Delete(olditer->key());
      olditer->Next();
    }
    else {
      int cmp = options.comparator->Compare(olditer->key(), newiter->key());
      if (cmp < 0) {
        batch.Delete(olditer->key());
        olditer->Next();
      }
      else if (cmp == 0) {
        if (options.comparator->Compare(olditer->value(), newiter->value()) != 0) {
          batch.Put(newiter->key(), newiter->value());
        }
        olditer->Next();
        newiter->Next();
      }
      else {
        batch.Put(newiter->key(), newiter->value());
        newiter->Next();
      }
    }
  }

  s = Write(WriteOptions(), &batch);
  
  delete olditer;
  delete oldtable;
  delete oldfile;
  delete newiter;
  delete newtable;
  delete newfile;

  return s;
}